

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeNewRowid(Rtree *pRtree,i64 *piRowid)

{
  sqlite3_int64 sVar1;
  sqlite3_stmt *in_RSI;
  long in_RDI;
  int rc;
  sqlite3_stmt *unaff_retaddr;
  sqlite3_stmt *in_stack_00000018;
  int iVar2;
  
  iVar2 = -0x55555556;
  sqlite3_bind_null(in_RSI,-0x55555556);
  sqlite3_bind_null(in_RSI,iVar2);
  sqlite3_step(in_stack_00000018);
  iVar2 = sqlite3_reset(unaff_retaddr);
  sVar1 = sqlite3_last_insert_rowid(*(sqlite3 **)(in_RDI + 0x18));
  *(sqlite3_int64 *)in_RSI = sVar1;
  return iVar2;
}

Assistant:

static int rtreeNewRowid(Rtree *pRtree, i64 *piRowid){
  int rc;
  sqlite3_bind_null(pRtree->pWriteRowid, 1);
  sqlite3_bind_null(pRtree->pWriteRowid, 2);
  sqlite3_step(pRtree->pWriteRowid);
  rc = sqlite3_reset(pRtree->pWriteRowid);
  *piRowid = sqlite3_last_insert_rowid(pRtree->db);
  return rc;
}